

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtil.cpp
# Opt level: O3

UINT_PTR Math::Rand(void)

{
  uint uVar1;
  uint local_1c [2];
  uint PAL_rand;
  
  rand_s(local_1c);
  uVar1 = local_1c[0];
  rand_s(local_1c);
  return CONCAT44(local_1c[0],uVar1);
}

Assistant:

UINT_PTR
Math::Rand()
{
    unsigned int rand;
    rand_s(&rand);
    UINT_PTR newRand = static_cast<UINT_PTR>(rand);

#if TARGET_64
    rand_s(&rand);
    newRand |= static_cast<UINT_PTR>(rand) << 32;
#endif

    return newRand;
}